

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_flac__seek_to_pcm_frame__seek_table(ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex)

{
  ulong *puVar1;
  uint uVar2;
  ma_dr_flac_seekpoint *pmVar3;
  bool bVar4;
  ma_bool32 mVar5;
  ma_result mVar6;
  ma_uint64 mVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ma_uint64 mVar12;
  ulong uVar13;
  ulong uVar14;
  ma_uint64 byteRangeHi;
  float fVar15;
  
  pmVar3 = pFlac->pSeekpoints;
  if (pmVar3 == (ma_dr_flac_seekpoint *)0x0) {
    return 0;
  }
  uVar2 = pFlac->seekpointCount;
  if ((ulong)uVar2 == 0) {
    return 0;
  }
  if (pcmFrameIndex < pmVar3->firstPCMFrame) {
    return 0;
  }
  uVar9 = 0;
  if (pmVar3->firstPCMFrame < pcmFrameIndex) {
    uVar8 = 0xffffffff;
    lVar10 = 0x18;
    do {
      uVar9 = uVar2 - 1;
      if ((ulong)uVar2 * 0x18 == lVar10) break;
      uVar8 = uVar8 + 1;
      puVar1 = (ulong *)((long)&pmVar3->firstPCMFrame + lVar10);
      lVar10 = lVar10 + 0x18;
      uVar9 = uVar8;
    } while (*puVar1 < pcmFrameIndex);
  }
  if (((pmVar3[uVar9].pcmFrameCount != 0) &&
      (pmVar3[uVar9].pcmFrameCount <= pFlac->maxBlockSizeInPCMFrames)) &&
     (uVar14 = pFlac->totalPCMFrameCount, pmVar3[uVar9].firstPCMFrame <= uVar14 || uVar14 == 0)) {
    if (uVar14 != 0) {
      fVar15 = (float)(long)((ulong)pFlac->bitsPerSample * uVar14 * pFlac->channels) * 0.125;
      uVar14 = (ulong)fVar15;
      mVar12 = pFlac->firstFLACFramePosInBytes;
      byteRangeHi = ((long)(fVar15 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14) + mVar12;
      if (uVar9 < uVar2 - 1) {
        if (pmVar3[uVar9 + 1].flacFrameOffset <= pmVar3[uVar9].flacFrameOffset) {
          return 0;
        }
        if (pmVar3[uVar9 + 1].pcmFrameCount == 0) {
          return 0;
        }
        if (pmVar3[uVar9 + 1].firstPCMFrame != 0xffffffffffffffff) {
          byteRangeHi = (mVar12 - 1) + pmVar3[uVar9 + 1].flacFrameOffset;
        }
      }
      mVar12 = pmVar3[uVar9].flacFrameOffset + mVar12;
      mVar5 = ma_dr_flac__seek_to_byte(&pFlac->bs,mVar12);
      if ((mVar5 != 0) &&
         (mVar5 = ma_dr_flac__read_next_flac_frame_header
                            (&pFlac->bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header),
         mVar5 != 0)) {
        mVar7 = (pFlac->currentFLACFrame).header.pcmFrameNumber;
        if (mVar7 == 0) {
          mVar7 = (ulong)pFlac->maxBlockSizeInPCMFrames *
                  (ulong)(pFlac->currentFLACFrame).header.flacFrameNumber;
        }
        pFlac->currentPCMFrame = mVar7;
        mVar5 = ma_dr_flac__seek_to_pcm_frame__binary_search_internal
                          (pFlac,pcmFrameIndex,mVar12,byteRangeHi);
        if (mVar5 != 0) {
          return 1;
        }
      }
    }
    uVar14 = pFlac->currentPCMFrame;
    uVar13 = pFlac->pSeekpoints[uVar9].firstPCMFrame;
    if ((pcmFrameIndex < uVar14) || (uVar14 < uVar13)) {
      mVar5 = ma_dr_flac__seek_to_byte
                        (&pFlac->bs,
                         pFlac->pSeekpoints[uVar9].flacFrameOffset + pFlac->firstFLACFramePosInBytes
                        );
      if (mVar5 == 0) {
        return 0;
      }
      mVar5 = ma_dr_flac__read_next_flac_frame_header
                        (&pFlac->bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header);
      bVar4 = true;
      if (mVar5 == 0) {
        return 0;
      }
    }
    else if (uVar14 == 0) {
      if ((pFlac->currentFLACFrame).pcmFramesRemaining == 0) {
        mVar5 = ma_dr_flac__read_next_flac_frame_header
                          (&pFlac->bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header);
        if (mVar5 == 0) {
          return 0;
        }
        bVar4 = true;
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        bVar4 = false;
      }
    }
    else {
      bVar4 = false;
      uVar13 = uVar14;
    }
    do {
      mVar12 = (pFlac->currentFLACFrame).header.pcmFrameNumber;
      if (mVar12 == 0) {
        mVar12 = (ulong)pFlac->maxBlockSizeInPCMFrames *
                 (ulong)(pFlac->currentFLACFrame).header.flacFrameNumber;
      }
      lVar10 = (pFlac->currentFLACFrame).header.blockSizeInPCMFrames + mVar12;
      lVar11 = lVar10 + -1;
      if (lVar10 == 0) {
        lVar11 = 0;
      }
      uVar14 = (uVar13 - mVar12) + lVar11 + 1;
      if (pcmFrameIndex < uVar14) {
        if (!bVar4) {
LAB_00176de4:
          mVar12 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,pcmFrameIndex - uVar13);
          return (uint)(mVar12 == pcmFrameIndex - uVar13);
        }
        mVar6 = ma_dr_flac__decode_flac_frame(pFlac);
        if (mVar6 != MA_CRC_MISMATCH) {
          if (mVar6 != MA_SUCCESS) {
            return 0;
          }
          goto LAB_00176de4;
        }
      }
      else {
        if (bVar4) {
          mVar6 = ma_dr_flac__seek_flac_frame(pFlac);
          if (mVar6 == MA_CRC_MISMATCH) goto LAB_00176dc1;
          uVar13 = uVar14;
          if (mVar6 != MA_SUCCESS) {
            return 0;
          }
        }
        else {
          uVar13 = uVar13 + (pFlac->currentFLACFrame).pcmFramesRemaining;
          (pFlac->currentFLACFrame).pcmFramesRemaining = 0;
        }
        if ((pFlac->totalPCMFrameCount == pcmFrameIndex) && (uVar13 == pFlac->totalPCMFrameCount)) {
          return 1;
        }
      }
LAB_00176dc1:
      mVar5 = ma_dr_flac__read_next_flac_frame_header
                        (&pFlac->bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header);
      bVar4 = true;
    } while (mVar5 != 0);
  }
  return 0;
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_pcm_frame__seek_table(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex)
{
    ma_uint32 iClosestSeekpoint = 0;
    ma_bool32 isMidFrame = MA_FALSE;
    ma_uint64 runningPCMFrameCount;
    ma_uint32 iSeekpoint;
    MA_DR_FLAC_ASSERT(pFlac != NULL);
    if (pFlac->pSeekpoints == NULL || pFlac->seekpointCount == 0) {
        return MA_FALSE;
    }
    if (pFlac->pSeekpoints[0].firstPCMFrame > pcmFrameIndex) {
        return MA_FALSE;
    }
    for (iSeekpoint = 0; iSeekpoint < pFlac->seekpointCount; ++iSeekpoint) {
        if (pFlac->pSeekpoints[iSeekpoint].firstPCMFrame >= pcmFrameIndex) {
            break;
        }
        iClosestSeekpoint = iSeekpoint;
    }
    if (pFlac->pSeekpoints[iClosestSeekpoint].pcmFrameCount == 0 || pFlac->pSeekpoints[iClosestSeekpoint].pcmFrameCount > pFlac->maxBlockSizeInPCMFrames) {
        return MA_FALSE;
    }
    if (pFlac->pSeekpoints[iClosestSeekpoint].firstPCMFrame > pFlac->totalPCMFrameCount && pFlac->totalPCMFrameCount > 0) {
        return MA_FALSE;
    }
#if !defined(MA_DR_FLAC_NO_CRC)
    if (pFlac->totalPCMFrameCount > 0) {
        ma_uint64 byteRangeLo;
        ma_uint64 byteRangeHi;
        byteRangeHi = pFlac->firstFLACFramePosInBytes + (ma_uint64)((ma_int64)(pFlac->totalPCMFrameCount * pFlac->channels * pFlac->bitsPerSample)/8.0f);
        byteRangeLo = pFlac->firstFLACFramePosInBytes + pFlac->pSeekpoints[iClosestSeekpoint].flacFrameOffset;
        if (iClosestSeekpoint < pFlac->seekpointCount-1) {
            ma_uint32 iNextSeekpoint = iClosestSeekpoint + 1;
            if (pFlac->pSeekpoints[iClosestSeekpoint].flacFrameOffset >= pFlac->pSeekpoints[iNextSeekpoint].flacFrameOffset || pFlac->pSeekpoints[iNextSeekpoint].pcmFrameCount == 0) {
                return MA_FALSE;
            }
            if (pFlac->pSeekpoints[iNextSeekpoint].firstPCMFrame != (((ma_uint64)0xFFFFFFFF << 32) | 0xFFFFFFFF)) {
                byteRangeHi = pFlac->firstFLACFramePosInBytes + pFlac->pSeekpoints[iNextSeekpoint].flacFrameOffset - 1;
            }
        }
        if (ma_dr_flac__seek_to_byte(&pFlac->bs, pFlac->firstFLACFramePosInBytes + pFlac->pSeekpoints[iClosestSeekpoint].flacFrameOffset)) {
            if (ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &pFlac->currentPCMFrame, NULL);
                if (ma_dr_flac__seek_to_pcm_frame__binary_search_internal(pFlac, pcmFrameIndex, byteRangeLo, byteRangeHi)) {
                    return MA_TRUE;
                }
            }
        }
    }
#endif
    if (pcmFrameIndex >= pFlac->currentPCMFrame && pFlac->pSeekpoints[iClosestSeekpoint].firstPCMFrame <= pFlac->currentPCMFrame) {
        runningPCMFrameCount = pFlac->currentPCMFrame;
        if (pFlac->currentPCMFrame == 0 && pFlac->currentFLACFrame.pcmFramesRemaining == 0) {
            if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                return MA_FALSE;
            }
        } else {
            isMidFrame = MA_TRUE;
        }
    } else {
        runningPCMFrameCount = pFlac->pSeekpoints[iClosestSeekpoint].firstPCMFrame;
        if (!ma_dr_flac__seek_to_byte(&pFlac->bs, pFlac->firstFLACFramePosInBytes + pFlac->pSeekpoints[iClosestSeekpoint].flacFrameOffset)) {
            return MA_FALSE;
        }
        if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
            return MA_FALSE;
        }
    }
    for (;;) {
        ma_uint64 pcmFrameCountInThisFLACFrame;
        ma_uint64 firstPCMFrameInFLACFrame = 0;
        ma_uint64 lastPCMFrameInFLACFrame = 0;
        ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &firstPCMFrameInFLACFrame, &lastPCMFrameInFLACFrame);
        pcmFrameCountInThisFLACFrame = (lastPCMFrameInFLACFrame - firstPCMFrameInFLACFrame) + 1;
        if (pcmFrameIndex < (runningPCMFrameCount + pcmFrameCountInThisFLACFrame)) {
            ma_uint64 pcmFramesToDecode = pcmFrameIndex - runningPCMFrameCount;
            if (!isMidFrame) {
                ma_result result = ma_dr_flac__decode_flac_frame(pFlac);
                if (result == MA_SUCCESS) {
                    return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, pcmFramesToDecode) == pcmFramesToDecode;
                } else {
                    if (result == MA_CRC_MISMATCH) {
                        goto next_iteration;
                    } else {
                        return MA_FALSE;
                    }
                }
            } else {
                return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, pcmFramesToDecode) == pcmFramesToDecode;
            }
        } else {
            if (!isMidFrame) {
                ma_result result = ma_dr_flac__seek_to_next_flac_frame(pFlac);
                if (result == MA_SUCCESS) {
                    runningPCMFrameCount += pcmFrameCountInThisFLACFrame;
                } else {
                    if (result == MA_CRC_MISMATCH) {
                        goto next_iteration;
                    } else {
                        return MA_FALSE;
                    }
                }
            } else {
                runningPCMFrameCount += pFlac->currentFLACFrame.pcmFramesRemaining;
                pFlac->currentFLACFrame.pcmFramesRemaining = 0;
                isMidFrame = MA_FALSE;
            }
            if (pcmFrameIndex == pFlac->totalPCMFrameCount && runningPCMFrameCount == pFlac->totalPCMFrameCount) {
                return MA_TRUE;
            }
        }
    next_iteration:
        if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
            return MA_FALSE;
        }
    }
}